

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O1

void __thiscall fat::print_directory(fat *this,int iteration_level,int32_t curr_dir)

{
  directory *pdVar1;
  pointer pdVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  string indent;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  if (0 < iteration_level) {
    iVar6 = iteration_level;
    do {
      std::__cxx11::string::append((char *)&local_50);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  pdVar2 = (this->dir_info).
           super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dir_info).super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
      ._M_impl.super__Vector_impl_data._M_finish != pdVar2) {
    uVar8 = 0;
    do {
      if (pdVar2[uVar8].parent_dir == curr_dir) {
        if ((pdVar2[uVar8].dir)->is_file == true) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
          pdVar2 = (this->dir_info).
                   super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->dir_info).
                            super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 4) <= uVar8
             ) {
LAB_001078f7:
            uVar5 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar8);
            if (local_50 != local_40) {
              operator_delete(local_50);
            }
            _Unwind_Resume(uVar5);
          }
          pdVar1 = pdVar2[uVar8].dir;
          if (pdVar1 == (directory *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            sVar4 = strlen(pdVar1->name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pdVar1->name,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          pdVar2 = (this->dir_info).
                   super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->dir_info).
                            super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 4) <= uVar8
             ) goto LAB_001078f7;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(pdVar2[uVar8].dir)->start_cluster);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          pdVar2 = (this->dir_info).
                   super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->dir_info).
                            super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 4) <= uVar8
             ) goto LAB_001078f7;
          iVar6 = (pdVar2[uVar8].dir)->start_cluster;
          iVar7 = 0;
          do {
            iVar6 = this->fat_table[iVar6];
            iVar7 = iVar7 + 1;
          } while (iVar6 != this->FAT_FILE_END);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        }
        else {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"+",1);
          pdVar2 = (this->dir_info).
                   super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->dir_info).
                            super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 4) <= uVar8
             ) goto LAB_001078f7;
          pdVar1 = pdVar2[uVar8].dir;
          if (pdVar1 == (directory *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            sVar4 = strlen(pdVar1->name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pdVar1->name,sVar4);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          pdVar2 = (this->dir_info).
                   super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->dir_info).
                            super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 4) <= uVar8
             ) goto LAB_001078f7;
          print_directory(this,iteration_level + 1,(pdVar2[uVar8].dir)->start_cluster);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"--",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        }
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      uVar8 = uVar8 + 1;
      pdVar2 = (this->dir_info).
               super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->dir_info).
                                   super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 4));
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void fat::print_directory(int iteration_level, int32_t curr_dir) {
    std::string indent = "";
    for (int i = 0; i < iteration_level; i++) {
        indent.append("\t");
    }
    for (int j = 0; j < dir_info.size(); j++) {
        if (dir_info.at(j).parent_dir == curr_dir) {
            if (dir_info.at(j).dir->is_file) {

                std::cout << indent << "-" << dir_info.at(j).dir->name << " " << dir_info.at(j).dir->start_cluster
                          << " " << get_cluster_count(dir_info.at(j).dir->start_cluster)
                          << std::endl;
            } else {
                std::cout << indent << "+" << dir_info.at(j).dir->name << std::endl;
                print_directory(iteration_level + 1, dir_info.at(j).dir->start_cluster);
                std::cout << indent << "--" << std::endl;
            }
        }
    }
}